

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O0

Status * __thiscall
draco::Encoder::SetAttributePredictionScheme(Encoder *this,Type type,int prediction_scheme_method)

{
  bool bVar1;
  EncoderOptionsBase<draco::GeometryAttribute::Type> *att_key;
  EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *in_RSI;
  DracoOptions<draco::GeometryAttribute::Type> *in_RDI;
  Status *status;
  int in_stack_000000e0;
  Type in_stack_000000e4;
  EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *in_stack_000000e8;
  int in_stack_ffffffffffffff7c;
  string *name;
  DracoOptions<draco::GeometryAttribute::Type> *this_00;
  allocator<char> local_51;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::CheckPredictionScheme
            (in_stack_000000e8,in_stack_000000e4,in_stack_000000e0);
  bVar1 = Status::ok((Status *)in_RDI);
  if (bVar1) {
    att_key = EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::options
                        (in_RSI);
    name = (string *)&local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    DracoOptions<draco::GeometryAttribute::Type>::SetAttributeInt
              (this_00,(AttributeKey *)att_key,name,in_stack_ffffffffffffff7c);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::allocator<char>::~allocator(&local_51);
  }
  return (Status *)this_00;
}

Assistant:

Status Encoder::SetAttributePredictionScheme(GeometryAttribute::Type type,
                                             int prediction_scheme_method) {
  Status status = CheckPredictionScheme(type, prediction_scheme_method);
  if (!status.ok()) {
    return status;
  }
  options().SetAttributeInt(type, "prediction_scheme",
                            prediction_scheme_method);
  return status;
}